

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v5::internal::
specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
::on_hash(specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_>
          *this)

{
  uint_least8_t *puVar1;
  
  require_numeric_argument(this);
  puVar1 = &(((this->
              super_specs_handler<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
              ).super_specs_setter<char>.specs_)->super_core_format_specs).flags;
  *puVar1 = *puVar1 | 8;
  return;
}

Assistant:

FMT_CONSTEXPR void on_hash() {
    require_numeric_argument();
    Handler::on_hash();
  }